

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O3

void nn_bipc_destroy(nn_epbase *self)

{
  nn_usock *self_00;
  int iVar1;
  uint uVar2;
  nn_fsm *pnVar3;
  nn_ctx *ctx;
  nn_list_item *pnVar4;
  nn_list_item *pnVar5;
  char *__s;
  size_t sVar6;
  nn_aipc *pnVar7;
  nn_aipc *in_RCX;
  uint *puVar8;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint uVar9;
  int extraout_EDX_03;
  long *in_RSI;
  long *plVar10;
  nn_ctx **ppnVar11;
  nn_bipc *pnVar12;
  nn_fsm *self_01;
  nn_aipc *unaff_R15;
  sockaddr asStack_120 [6];
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  nn_fsm *pnStack_a0;
  nn_aipc *pnStack_98;
  nn_aipc *pnStack_90;
  undefined1 auStack_38 [8];
  nn_fsm_fn p_Stack_30;
  nn_fsm *pnStack_28;
  
  pnVar3 = (nn_fsm *)(self + -6);
  if (self == (nn_epbase *)0x0) {
    pnVar3 = (nn_fsm *)0x0;
  }
  ppnVar11 = (nn_ctx **)(ulong)*(uint *)&pnVar3[1].fn;
  if (*(uint *)&pnVar3[1].fn == 1) {
    ppnVar11 = &pnVar3[8].ctx;
    nn_list_term((nn_list *)ppnVar11);
    if (pnVar3[8].owner == (nn_fsm *)0x0) {
      nn_usock_term((nn_usock *)&pnVar3[1].srcptr);
      nn_backoff_term((nn_backoff *)&pnVar3[8].stopped.src);
      nn_epbase_term((nn_epbase *)&pnVar3[1].shutdown_fn);
      nn_fsm_term(pnVar3);
      nn_free(pnVar3);
      return;
    }
  }
  else {
    nn_bipc_destroy_cold_1();
  }
  nn_bipc_destroy_cold_2();
  pnVar12 = (nn_bipc *)0x3f0;
  plVar10 = in_RSI;
  pnStack_28 = pnVar3;
  pnVar3 = (nn_fsm *)nn_alloc_(0x3f0);
  iVar1 = (int)plVar10;
  if (pnVar3 == (nn_fsm *)0x0) {
    nn_bipc_create_cold_3();
LAB_0012a2de:
    nn_bipc_create_cold_1();
  }
  else {
    unaff_R15 = (nn_aipc *)&pnVar3[1].shutdown_fn;
    nn_epbase_init((nn_epbase *)unaff_R15,&nn_bipc_epbase_vfptr,ppnVar11);
    ctx = nn_epbase_getctx((nn_epbase *)unaff_R15);
    nn_fsm_init_root(pnVar3,nn_bipc_handler,nn_bipc_shutdown,ctx);
    *(undefined4 *)&pnVar3[1].fn = 1;
    p_Stack_30 = (nn_fsm_fn)0x4;
    in_RCX = (nn_aipc *)(auStack_38 + 4);
    iVar1 = 0;
    pnVar12 = (nn_bipc *)unaff_R15;
    nn_epbase_getopt((nn_epbase *)unaff_R15,0,6,in_RCX,(size_t *)&p_Stack_30);
    if (p_Stack_30 != (nn_fsm_fn)0x4) goto LAB_0012a2de;
    in_RCX = (nn_aipc *)auStack_38;
    iVar1 = 0;
    pnVar12 = (nn_bipc *)unaff_R15;
    nn_epbase_getopt((nn_epbase *)unaff_R15,0,7,in_RCX,(size_t *)&p_Stack_30);
    if (p_Stack_30 == (nn_fsm_fn)0x4) {
      if (auStack_38._0_4_ == 0) {
        auStack_38._0_4_ = auStack_38._4_4_;
      }
      nn_backoff_init((nn_backoff *)&pnVar3[8].stopped.src,3,auStack_38._4_4_,auStack_38._0_4_,
                      pnVar3);
      nn_usock_init((nn_usock *)&pnVar3[1].srcptr,1,pnVar3);
      pnVar3[8].owner = (nn_fsm *)0x0;
      nn_list_init((nn_list *)&pnVar3[8].ctx);
      nn_fsm_start(pnVar3);
      *in_RSI = (long)unaff_R15;
      return;
    }
  }
  nn_bipc_create_cold_2();
  puVar8 = &switchD_0012a310::switchdataD_00134fd4;
  uVar2 = extraout_EDX;
  switch(pnVar12->state) {
  case 1:
    if (iVar1 == -2) {
      if (extraout_EDX == 0xfffffffe) goto LAB_0012a339;
      nn_bipc_handler_cold_11();
      uVar2 = extraout_EDX_00;
      goto switchD_0012a310_caseD_9;
    }
LAB_0012a466:
    nn_bipc_handler_cold_10();
    break;
  case 2:
    unaff_R15 = pnVar12->aipc;
    if (unaff_R15 == in_RCX) {
      if (extraout_EDX == 0x85b7) {
        pnVar4 = nn_list_end(&pnVar12->aipcs);
        nn_list_insert(&pnVar12->aipcs,&unaff_R15->item,pnVar4);
        pnVar12->aipc = (nn_aipc *)0x0;
        nn_bipc_start_accepting(pnVar12);
        return;
      }
      goto LAB_0012a489;
    }
    if (iVar1 != 2) {
      nn_bipc_handler_cold_7();
      goto LAB_0012a44b;
    }
    if (extraout_EDX == 0x85b9) {
      nn_list_erase(&pnVar12->aipcs,&in_RCX->item);
      nn_aipc_term(in_RCX);
      nn_free(in_RCX);
      return;
    }
    uVar2 = 2;
    uVar9 = extraout_EDX;
    if (extraout_EDX == 0x85b8) {
      nn_aipc_stop(in_RCX);
      return;
    }
    goto LAB_0012a492;
  default:
    goto switchD_0012a310_caseD_3;
  case 7:
    if (iVar1 != 3) goto LAB_0012a454;
    if (extraout_EDX == 1) {
      nn_backoff_stop(&pnVar12->retry);
      pnVar12->state = 9;
      return;
    }
    goto LAB_0012a476;
  case 8:
    if (iVar1 != 1) goto LAB_0012a45d;
    if (extraout_EDX == 8) {
      return;
    }
    if (extraout_EDX == 7) {
      nn_backoff_start(&pnVar12->retry);
      pnVar12->state = 7;
      return;
    }
    goto LAB_0012a482;
  case 9:
switchD_0012a310_caseD_9:
    if (iVar1 != 3) {
LAB_0012a44b:
      nn_bipc_handler_cold_1();
LAB_0012a454:
      nn_bipc_handler_cold_3();
LAB_0012a45d:
      nn_bipc_handler_cold_5();
      goto LAB_0012a466;
    }
    if (uVar2 == 2) {
LAB_0012a339:
      nn_bipc_start_listening(pnVar12);
      return;
    }
  }
  nn_bipc_handler_cold_2();
LAB_0012a476:
  nn_bipc_handler_cold_4();
switchD_0012a310_caseD_3:
  nn_bipc_handler_cold_12();
LAB_0012a482:
  nn_bipc_handler_cold_6();
  uVar2 = extraout_EDX_01;
LAB_0012a489:
  nn_bipc_handler_cold_9();
  uVar9 = extraout_EDX_02;
LAB_0012a492:
  pnVar3 = (nn_fsm *)(ulong)uVar9;
  nn_bipc_handler_cold_8();
  if (extraout_EDX_03 == -3 && uVar2 == 0xfffffffe) {
LAB_0012a4d8:
    nn_backoff_stop((nn_backoff *)&pnVar3[8].stopped.src);
    if ((nn_aipc *)pnVar3[8].owner != (nn_aipc *)0x0) {
      nn_aipc_stop((nn_aipc *)pnVar3[8].owner);
      *(undefined4 *)&pnVar3[1].fn = 3;
LAB_0012a504:
      iVar1 = nn_aipc_isidle((nn_aipc *)pnVar3[8].owner);
      if (iVar1 == 0) {
        return;
      }
      nn_aipc_term((nn_aipc *)pnVar3[8].owner);
      nn_free(pnVar3[8].owner);
      pnVar3[8].owner = (nn_fsm *)0x0;
      nn_usock_stop((nn_usock *)&pnVar3[1].srcptr);
    }
    *(undefined4 *)&pnVar3[1].fn = 4;
  }
  else {
    uVar9 = *(uint *)&pnVar3[1].fn;
    pnVar12 = (nn_bipc *)(ulong)uVar9;
    if (uVar9 == 5) {
      if ((uVar2 == 2) && (extraout_EDX_03 == 0x85b9)) {
        nn_list_erase((nn_list *)&pnVar3[8].ctx,&((nn_aipc *)puVar8)->item);
        nn_aipc_term((nn_aipc *)puVar8);
        nn_free(puVar8);
        goto LAB_0012a5f3;
      }
      nn_bipc_shutdown_cold_1();
      pnStack_a0 = pnVar3;
      pnStack_98 = (nn_aipc *)puVar8;
      pnStack_90 = unaff_R15;
      __s = nn_epbase_getaddr(&pnVar12->epbase);
      uStack_b8 = 0;
      uStack_b0 = 0;
      uStack_a8 = 0;
      sVar6 = strlen(__s);
      if (0x6b < sVar6) {
        nn_bipc_start_listening_cold_4();
        goto LAB_0012a793;
      }
      asStack_120[0].sa_family = 1;
      strncpy(asStack_120[0].sa_data,__s,0x6c);
      uVar2 = socket(1,1,0);
      if ((int)uVar2 < 0) {
LAB_0012a71d:
        self_00 = &pnVar12->usock;
        iVar1 = nn_usock_start(self_00,1,1,0);
        if (-1 < iVar1) {
          iVar1 = nn_usock_bind(self_00,(sockaddr *)asStack_120,0x6e);
          if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self_00,10), -1 < iVar1)) {
            nn_bipc_start_accepting(pnVar12);
            pnVar12->state = 2;
            return;
          }
          nn_usock_stop(self_00);
          pnVar12->state = 8;
          return;
        }
LAB_0012a793:
        nn_backoff_start(&pnVar12->retry);
        pnVar12->state = 7;
        return;
      }
      iVar1 = fcntl(uVar2,4,0x800);
      if (iVar1 == -1) {
        puVar8 = (uint *)__errno_location();
        pnVar3 = (nn_fsm *)(ulong)*puVar8;
        if (*puVar8 == 0x16) goto LAB_0012a6d3;
      }
      else {
LAB_0012a6d3:
        iVar1 = connect(uVar2,asStack_120,0x6e);
        if ((((iVar1 == -1) && (puVar8 = (uint *)__errno_location(), *puVar8 == 0x6f)) &&
            (iVar1 = unlink(__s), iVar1 != 0)) && (pnVar3 = (nn_fsm *)(ulong)*puVar8, *puVar8 != 2))
        goto LAB_0012a7b5;
        pnVar3 = (nn_fsm *)(ulong)uVar2;
        iVar1 = close(uVar2);
        if (iVar1 == 0) goto LAB_0012a71d;
        nn_bipc_start_listening_cold_3();
      }
      nn_bipc_start_listening_cold_1();
LAB_0012a7b5:
      nn_bipc_start_listening_cold_2();
      if (pnVar3[8].owner == (nn_fsm *)0x0) {
        self_01 = (nn_fsm *)0x740;
        pnVar7 = (nn_aipc *)nn_alloc_(0x740);
        pnVar3[8].owner = (nn_fsm *)pnVar7;
        if (pnVar7 != (nn_aipc *)0x0) {
          nn_aipc_init(pnVar7,2,(nn_epbase *)&pnVar3[1].shutdown_fn,pnVar3);
          nn_aipc_start((nn_aipc *)pnVar3[8].owner,(nn_usock *)&pnVar3[1].srcptr);
          return;
        }
      }
      else {
        nn_bipc_start_accepting_cold_1();
        self_01 = pnVar3;
      }
      nn_bipc_start_accepting_cold_2();
      if (self_01 != (nn_fsm *)0x0) {
        self_01 = (nn_fsm *)&self_01[-2].stopped.item;
      }
      nn_fsm_stop(self_01);
      return;
    }
    if (uVar9 == 3) goto LAB_0012a504;
    if (uVar9 != 4) {
      nn_bipc_shutdown_cold_2();
      goto LAB_0012a4d8;
    }
  }
  iVar1 = nn_usock_isidle((nn_usock *)&pnVar3[1].srcptr);
  if (iVar1 == 0) {
    return;
  }
  iVar1 = nn_backoff_isidle((nn_backoff *)&pnVar3[8].stopped.src);
  if (iVar1 == 0) {
    return;
  }
  ppnVar11 = &pnVar3[8].ctx;
  for (pnVar4 = nn_list_begin((nn_list *)ppnVar11); pnVar5 = nn_list_end((nn_list *)ppnVar11),
      pnVar4 != pnVar5; pnVar4 = nn_list_next((nn_list *)ppnVar11,pnVar4)) {
    pnVar7 = (nn_aipc *)(pnVar4 + -0x73);
    if (pnVar4 == (nn_list_item *)0x0) {
      pnVar7 = (nn_aipc *)0x0;
    }
    nn_aipc_stop(pnVar7);
  }
  *(undefined4 *)&pnVar3[1].fn = 5;
LAB_0012a5f3:
  iVar1 = nn_list_empty((nn_list *)&pnVar3[8].ctx);
  if (iVar1 == 0) {
    return;
  }
  *(undefined4 *)&pnVar3[1].fn = 1;
  nn_fsm_stopped_noevent(pnVar3);
  nn_epbase_stopped((nn_epbase *)&pnVar3[1].shutdown_fn);
  return;
}

Assistant:

static void nn_bipc_destroy (struct nn_epbase *self)
{
    struct nn_bipc *bipc;

    bipc = nn_cont (self, struct nn_bipc, epbase);

    nn_assert_state (bipc, NN_BIPC_STATE_IDLE);
    nn_list_term (&bipc->aipcs);
    nn_assert (bipc->aipc == NULL);
    nn_usock_term (&bipc->usock);
    nn_backoff_term (&bipc->retry);
    nn_epbase_term (&bipc->epbase);
    nn_fsm_term (&bipc->fsm);

    nn_free (bipc);
}